

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr.c
# Opt level: O0

Aig_Man_t * Saig_ManDupUnfoldConstrs(Aig_Man_t *pAig)

{
  Vec_Ptr_t *p;
  int iVar1;
  Aig_Man_t *pAVar2;
  char *pcVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  void *pvVar6;
  Aig_Obj_t *p1;
  int local_60;
  int RetValue;
  int k;
  int i;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pMiter;
  Aig_Man_t *pAigNew;
  Vec_Ptr_t *vCons0;
  Vec_Ptr_t *vCons;
  Vec_Ptr_t *vOuts;
  Vec_Ptr_t *vConsAll;
  Vec_Ptr_t *vOutsAll;
  Aig_Man_t *pAig_local;
  
  vOutsAll = (Vec_Ptr_t *)pAig;
  iVar1 = Saig_ManPoNum(pAig);
  vConsAll = Vec_PtrAlloc(iVar1);
  iVar1 = Saig_ManPoNum((Aig_Man_t *)vOutsAll);
  vOuts = Vec_PtrAlloc(iVar1);
  for (RetValue = 0; iVar1 = Saig_ManPoNum((Aig_Man_t *)vOutsAll), RetValue < iVar1;
      RetValue = RetValue + 1) {
    Vec_PtrEntry((Vec_Ptr_t *)vOutsAll[1].pArray,RetValue);
    iVar1 = Saig_ManDetectConstr((Aig_Man_t *)vOutsAll,RetValue,&vCons,&vCons0);
    if (iVar1 == 0) {
      Vec_PtrFreeP(&vCons);
      Vec_PtrFreeP(&vCons0);
      Vec_VecFree((Vec_Vec_t *)vConsAll);
      Vec_VecFree((Vec_Vec_t *)vOuts);
      pAVar2 = Aig_ManDupDfs((Aig_Man_t *)vOutsAll);
      return pAVar2;
    }
    Vec_PtrSort(vCons,Saig_ManDupCompare);
    Vec_PtrSort(vCons0,Saig_ManDupCompare);
    Vec_PtrPush(vConsAll,vCons);
    Vec_PtrPush(vOuts,vCons0);
  }
  pAigNew = (Aig_Man_t *)Vec_PtrEntry(vOuts,0);
  for (RetValue = 0; iVar1 = Vec_PtrSize(vOuts), RetValue < iVar1; RetValue = RetValue + 1) {
    vCons0 = (Vec_Ptr_t *)Vec_PtrEntry(vOuts,RetValue);
    iVar1 = Vec_PtrSize(vCons0);
    if (iVar1 != 0) {
      pAigNew = (Aig_Man_t *)vCons0;
    }
  }
  for (RetValue = 0; iVar1 = Vec_PtrSize(vOuts), RetValue < iVar1; RetValue = RetValue + 1) {
    vCons0 = (Vec_Ptr_t *)Vec_PtrEntry(vOuts,RetValue);
    vCons = (Vec_Ptr_t *)Vec_PtrEntry(vConsAll,RetValue);
    iVar1 = Vec_PtrSize(vCons);
    if (iVar1 == 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(vCons,0);
      pAVar5 = Aig_ManConst1((Aig_Man_t *)vOutsAll);
      if (pAVar4 != pAVar5) goto LAB_008598d5;
    }
    else {
LAB_008598d5:
      iVar1 = Vec_PtrEqual((Vec_Ptr_t *)pAigNew,vCons0);
      if (iVar1 == 0) break;
    }
  }
  iVar1 = Vec_PtrSize(vOuts);
  if (RetValue < iVar1) {
    printf("Collected constraints are not compatible.\n");
    Vec_VecFree((Vec_Vec_t *)vConsAll);
    Vec_VecFree((Vec_Vec_t *)vOuts);
    pAig_local = Aig_ManDupDfs((Aig_Man_t *)vOutsAll);
  }
  else {
    iVar1 = Aig_ManNodeNum((Aig_Man_t *)vOutsAll);
    pAVar2 = Aig_ManStart(iVar1);
    pcVar3 = Abc_UtilStrsav(*(char **)vOutsAll);
    pAVar2->pName = pcVar3;
    pAVar4 = Aig_ManConst1(pAVar2);
    pAVar5 = Aig_ManConst1((Aig_Man_t *)vOutsAll);
    (pAVar5->field_5).pData = pAVar4;
    for (RetValue = 0; iVar1 = Vec_PtrSize(*(Vec_Ptr_t **)(vOutsAll + 1)), RetValue < iVar1;
        RetValue = RetValue + 1) {
      pvVar6 = Vec_PtrEntry(*(Vec_Ptr_t **)(vOutsAll + 1),RetValue);
      pAVar4 = Aig_ObjCreateCi(pAVar2);
      *(Aig_Obj_t **)((long)pvVar6 + 0x28) = pAVar4;
    }
    for (RetValue = 0; iVar1 = Vec_PtrSize(*(Vec_Ptr_t **)(vOutsAll + 2)), RetValue < iVar1;
        RetValue = RetValue + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(*(Vec_Ptr_t **)(vOutsAll + 2),RetValue);
      if ((pAVar4 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar4), iVar1 != 0)) {
        pAVar5 = Aig_ObjChild0Copy(pAVar4);
        p1 = Aig_ObjChild1Copy(pAVar4);
        pAVar5 = Aig_And(pAVar2,pAVar5,p1);
        (pAVar4->field_5).pData = pAVar5;
      }
    }
    for (RetValue = 0; iVar1 = Vec_PtrSize(vConsAll), RetValue < iVar1; RetValue = RetValue + 1) {
      vCons = (Vec_Ptr_t *)Vec_PtrEntry(vConsAll,RetValue);
      pObj = Aig_ManConst1(pAVar2);
      for (local_60 = 0; iVar1 = Vec_PtrSize(vCons), local_60 < iVar1; local_60 = local_60 + 1) {
        pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(vCons,local_60);
        pAVar4 = Aig_ObjRealCopy(pAVar4);
        pAVar4 = Aig_Not(pAVar4);
        pObj = Aig_And(pAVar2,pObj,pAVar4);
      }
      Aig_ObjCreateCo(pAVar2,pObj);
    }
    iVar1 = Vec_PtrSize((Vec_Ptr_t *)pAigNew);
    pAVar2->nConstrs = iVar1;
    for (RetValue = 0; iVar1 = Vec_PtrSize((Vec_Ptr_t *)pAigNew), RetValue < iVar1;
        RetValue = RetValue + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)pAigNew,RetValue);
      pAVar4 = Aig_ObjRealCopy(pAVar4);
      Aig_ObjCreateCo(pAVar2,pAVar4);
    }
    for (RetValue = 0; iVar1 = Saig_ManRegNum((Aig_Man_t *)vOutsAll), RetValue < iVar1;
        RetValue = RetValue + 1) {
      p = (Vec_Ptr_t *)vOutsAll[1].pArray;
      iVar1 = Saig_ManPoNum((Aig_Man_t *)vOutsAll);
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p,RetValue + iVar1);
      pAVar4 = Aig_ObjChild0Copy(pAVar4);
      Aig_ObjCreateCo(pAVar2,pAVar4);
    }
    Vec_VecFree((Vec_Vec_t *)vConsAll);
    Vec_VecFree((Vec_Vec_t *)vOuts);
    iVar1 = Aig_ManRegNum((Aig_Man_t *)vOutsAll);
    Aig_ManSetRegNum(pAVar2,iVar1);
    Aig_ManCleanup(pAVar2);
    Aig_ManSeqCleanup(pAVar2);
    pAig_local = pAVar2;
  }
  return pAig_local;
}

Assistant:

Aig_Man_t * Saig_ManDupUnfoldConstrs( Aig_Man_t * pAig )
{
    Vec_Ptr_t * vOutsAll, * vConsAll;
    Vec_Ptr_t * vOuts, * vCons, * vCons0;
    Aig_Man_t * pAigNew;
    Aig_Obj_t * pMiter, * pObj;
    int i, k, RetValue;
    // detect constraints for each output
    vOutsAll = Vec_PtrAlloc( Saig_ManPoNum(pAig) );
    vConsAll = Vec_PtrAlloc( Saig_ManPoNum(pAig) );
    Saig_ManForEachPo( pAig, pObj, i )
    {
        RetValue = Saig_ManDetectConstr( pAig, i, &vOuts, &vCons );
        if ( RetValue == 0 )
        {
            Vec_PtrFreeP( &vOuts );
            Vec_PtrFreeP( &vCons );
            Vec_VecFree( (Vec_Vec_t *)vOutsAll );
            Vec_VecFree( (Vec_Vec_t *)vConsAll );
            return Aig_ManDupDfs( pAig );
        }
        Vec_PtrSort( vOuts, (int (*)(void))Saig_ManDupCompare );
        Vec_PtrSort( vCons, (int (*)(void))Saig_ManDupCompare );
        Vec_PtrPush( vOutsAll, vOuts );
        Vec_PtrPush( vConsAll, vCons );
    }
    // check if constraints are compatible
    vCons0 = (Vec_Ptr_t *)Vec_PtrEntry( vConsAll, 0 );
    Vec_PtrForEachEntry( Vec_Ptr_t *, vConsAll, vCons, i )
        if ( Vec_PtrSize(vCons) )
            vCons0 = vCons;
    Vec_PtrForEachEntry( Vec_Ptr_t *, vConsAll, vCons, i )
    {
        // Constant 0 outputs are always compatible (vOuts stores the negation)
        vOuts = (Vec_Ptr_t *)Vec_PtrEntry( vOutsAll, i );
        if ( Vec_PtrSize(vOuts) == 1 && (Aig_Obj_t *)Vec_PtrEntry( vOuts, 0 ) == Aig_ManConst1(pAig) )
            continue;
        if ( !Vec_PtrEqual(vCons0, vCons) )
            break;
    }
    if ( i < Vec_PtrSize(vConsAll) )
    {
        printf( "Collected constraints are not compatible.\n" );
        Vec_VecFree( (Vec_Vec_t *)vOutsAll );
        Vec_VecFree( (Vec_Vec_t *)vConsAll );
        return Aig_ManDupDfs( pAig );
    }

    // start the new manager
    pAigNew = Aig_ManStart( Aig_ManNodeNum(pAig) );
    pAigNew->pName = Abc_UtilStrsav( pAig->pName );
    // map the constant node
    Aig_ManConst1(pAig)->pData = Aig_ManConst1( pAigNew );
    // create variables for PIs
    Aig_ManForEachCi( pAig, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pAigNew );
    // add internal nodes of this frame
    Aig_ManForEachNode( pAig, pObj, i )
        pObj->pData = Aig_And( pAigNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // transform each output
    Vec_PtrForEachEntry( Vec_Ptr_t *, vOutsAll, vOuts, i )
    {
        // AND the outputs
        pMiter = Aig_ManConst1( pAigNew );
        Vec_PtrForEachEntry( Aig_Obj_t *, vOuts, pObj, k )
            pMiter = Aig_And( pAigNew, pMiter, Aig_Not(Aig_ObjRealCopy(pObj)) );
        Aig_ObjCreateCo( pAigNew, pMiter );
    }
    // add constraints
    pAigNew->nConstrs = Vec_PtrSize(vCons0);
    Vec_PtrForEachEntry( Aig_Obj_t *, vCons0, pObj, i )
        Aig_ObjCreateCo( pAigNew, Aig_ObjRealCopy(pObj) );
    // transfer to register outputs
    Saig_ManForEachLi( pAig, pObj, i )
        Aig_ObjCreateCo( pAigNew, Aig_ObjChild0Copy(pObj) );
//    Vec_PtrFreeP( &vOuts );
//    Vec_PtrFreeP( &vCons );
    Vec_VecFree( (Vec_Vec_t *)vOutsAll );
    Vec_VecFree( (Vec_Vec_t *)vConsAll );

    Aig_ManSetRegNum( pAigNew, Aig_ManRegNum(pAig) );
    Aig_ManCleanup( pAigNew );
    Aig_ManSeqCleanup( pAigNew );
    return pAigNew;
}